

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,double v)

{
  int iVar1;
  char *__s;
  FixedBuffer<4000> *in_RDI;
  undefined8 in_XMM0_Qa;
  int len;
  
  iVar1 = FixedBuffer<4000>::avail(in_RDI);
  if (0x1f < iVar1) {
    __s = FixedBuffer<4000>::current((FixedBuffer<4000> *)(in_RDI->data_ + 8));
    iVar1 = snprintf(__s,0x20,"%.12g",in_XMM0_Qa);
    FixedBuffer<4000>::add((FixedBuffer<4000> *)(in_RDI->data_ + 8),(long)iVar1);
  }
  return (LogStream *)in_RDI;
}

Assistant:

LogStream& LogStream::operator<<(double v){
    if(buffer_.avail() >= kMaxNumericSize){
        int len = snprintf(buffer_.current(), kMaxNumericSize, "%.12g", v);
        buffer_.add(len);
    }
    return *this;
}